

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<Header>::Inserter::insertOne(Inserter *this,qsizetype pos,Header *t)

{
  Header *pHVar1;
  Data *pDVar2;
  char *pcVar3;
  qsizetype qVar4;
  Header *pHVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  long in_FS_OFFSET;
  anon_class_8_1_a78179b7_conflict local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pHVar1 = this->begin;
  lVar10 = this->size;
  pHVar5 = pHVar1 + lVar10;
  this->end = pHVar5;
  this->last = pHVar1 + lVar10 + -1;
  this->where = pHVar1 + pos;
  lVar9 = lVar10 - pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar9;
  this->sourceCopyAssign = 1;
  if (lVar9 < 1) {
    this->sourceCopyConstruct = 1 - lVar9;
    this->move = 0;
    this->sourceCopyAssign = lVar9;
  }
  lVar9 = this->sourceCopyConstruct;
  (pHVar5->name).data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
  super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
  super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
  super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
  super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
  super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index = 0xff;
  local_40.__lhs = (_Move_ctor_base<false,_QHttpHeaders::WellKnownHeader,_QByteArray> *)pHVar5;
  if (lVar9 == 0) {
    (pHVar5->name).data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index =
         pHVar5[-1].name.data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
         super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
         super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
         super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
         super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
         super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&&>
      ::_S_vtable._M_arr
      [(long)(char)pHVar5[-1].name.data.
                   super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index
       + 1]._M_data)(&local_40,
                     (variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)(pHVar1 + lVar10 + -1));
    pDVar2 = pHVar5[-1].value.d.d;
    pcVar3 = pHVar5[-1].value.d.ptr;
    pHVar5[-1].value.d.d = (Data *)0x0;
    pHVar5[-1].value.d.ptr = (char *)0x0;
    (pHVar5->value).d.d = pDVar2;
    (pHVar5->value).d.ptr = pcVar3;
    qVar4 = pHVar5[-1].value.d.size;
    pHVar5[-1].value.d.size = 0;
    (pHVar5->value).d.size = qVar4;
    this->size = this->size + 1;
    if (this->move != 0) {
      lVar9 = 0;
      lVar10 = 0;
      do {
        pHVar5 = this->last;
        local_40.__lhs =
             (_Move_ctor_base<false,_QHttpHeaders::WellKnownHeader,_QByteArray> *)
             ((long)&(pHVar5->name).data.
                     super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                     super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                     super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                     super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                     super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                     super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_u +
             lVar9);
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&>
          ::_S_vtable._M_arr[(long)*(char *)((long)pHVar5 + lVar9 + -0x20) + 1]._M_data)
                  ((anon_class_8_1_8991fb9c *)&local_40,
                   (variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)
                   ((long)&pHVar5[-1].name.data.
                           super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                           super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                           super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                           super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                           super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                           super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                           _M_u + lVar9));
        uVar6 = *(undefined8 *)((long)&(pHVar5->value).d.d + lVar9);
        uVar7 = *(undefined8 *)((long)&(pHVar5->value).d.ptr + lVar9);
        uVar8 = *(undefined8 *)((long)pHVar5 + lVar9 + -0x10);
        *(undefined8 *)((long)&(pHVar5->value).d.d + lVar9) =
             *(undefined8 *)((long)pHVar5 + lVar9 + -0x18);
        *(undefined8 *)((long)&(pHVar5->value).d.ptr + lVar9) = uVar8;
        *(undefined8 *)((long)pHVar5 + lVar9 + -0x18) = uVar6;
        *(undefined8 *)((long)pHVar5 + lVar9 + -0x10) = uVar7;
        uVar6 = *(undefined8 *)((long)&(pHVar5->value).d.size + lVar9);
        *(undefined8 *)((long)&(pHVar5->value).d.size + lVar9) =
             *(undefined8 *)((long)pHVar5 + lVar9 + -8);
        *(undefined8 *)((long)pHVar5 + lVar9 + -8) = uVar6;
        lVar10 = lVar10 + -1;
        lVar9 = lVar9 + -0x38;
      } while (lVar10 != this->move);
    }
    pHVar5 = this->where;
    local_40.__lhs = (_Move_ctor_base<false,_QHttpHeaders::WellKnownHeader,_QByteArray> *)pHVar5;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&>
      ::_S_vtable._M_arr
      [(long)(char)(t->name).data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index
       + 1]._M_data)((anon_class_8_1_8991fb9c *)&local_40,
                     (variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)t);
    pDVar2 = (pHVar5->value).d.d;
    (pHVar5->value).d.d = (t->value).d.d;
    (t->value).d.d = pDVar2;
    pcVar3 = (pHVar5->value).d.ptr;
    (pHVar5->value).d.ptr = (t->value).d.ptr;
    (t->value).d.ptr = pcVar3;
    qVar4 = (pHVar5->value).d.size;
    (pHVar5->value).d.size = (t->value).d.size;
    (t->value).d.size = qVar4;
  }
  else {
    (pHVar5->name).data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index =
         (t->name).data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
         super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
         super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
         super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
         super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
         super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&&>
      ::_S_vtable._M_arr
      [(long)(char)(t->name).data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index
       + 1]._M_data)(&local_40,(variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)t);
    pDVar2 = (t->value).d.d;
    (t->value).d.d = (Data *)0x0;
    (pHVar5->value).d.d = pDVar2;
    pcVar3 = (t->value).d.ptr;
    (t->value).d.ptr = (char *)0x0;
    (pHVar5->value).d.ptr = pcVar3;
    qVar4 = (t->value).d.size;
    (t->value).d.size = 0;
    (pHVar5->value).d.size = qVar4;
    this->size = this->size + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insertOne(qsizetype pos, T &&t)
        {
            setup(pos, 1);

            if (sourceCopyConstruct) {
                Q_ASSERT(sourceCopyConstruct == 1);
                new (end) T(std::move(t));
                ++size;
            } else {
                // create a new element at the end by move constructing one existing element
                // inside the array.
                new (end) T(std::move(*(end - 1)));
                ++size;

                // now move assign existing elements towards the end
                for (qsizetype i = 0; i != move; --i)
                    last[i] = std::move(last[i - 1]);

                // and move the new item into place
                *where = std::move(t);
            }
        }